

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

ssh_key * opensshcert_new_priv(ssh_keyalg *self,ptrlen pub,ptrlen priv)

{
  ptrlen pVar1;
  opensshcert_key *poVar2;
  ssh_key *psVar3;
  strbuf *basepub;
  strbuf *local_30;
  
  poVar2 = opensshcert_new_shared(self,pub,&local_30);
  if (poVar2 != (opensshcert_key *)0x0) {
    pVar1.ptr = local_30->u;
    pVar1.len = local_30->len;
    psVar3 = (*self->base_alg->new_priv)(self->base_alg,pVar1,priv);
    poVar2->basekey = psVar3;
    strbuf_free(local_30);
    psVar3 = &poVar2->sshk;
    if (poVar2->basekey != (ssh_key *)0x0) {
      return psVar3;
    }
    (*psVar3->vt->freekey)(psVar3);
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *opensshcert_new_priv(
    const ssh_keyalg *self, ptrlen pub, ptrlen priv)
{
    strbuf *basepub;
    opensshcert_key *ck = opensshcert_new_shared(self, pub, &basepub);
    if (!ck)
        return NULL;

    ck->basekey = ssh_key_new_priv(self->base_alg,
                                   ptrlen_from_strbuf(basepub), priv);
    strbuf_free(basepub);

    if (!ck->basekey) {
        ssh_key_free(&ck->sshk);
        return NULL;
    }

    return &ck->sshk;
}